

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gait_plan.c
# Opt level: O0

Matrix_t Calc_GaitTrajPoint_Walk(void)

{
  int iVar1;
  int iVar2;
  float *pMatrix;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  Matrix_t MVar9;
  Matrix_t sMatrix;
  Matrix_t sMatrix_00;
  Matrix_t sMatrix_01;
  Matrix_t sMatrix_02;
  Matrix_t sMatrix_03;
  Matrix_t sMatrix_04;
  Matrix_t sMatrix_05;
  Matrix_t sMatrix_06;
  Matrix_t sMatrix_07;
  Matrix_t sMatrix_08;
  Matrix_t sMatrix_09;
  Matrix_t sMatrix_10;
  Matrix_t sMatrix_11;
  Matrix_t sMatrix_12;
  Matrix_t sMatrix_13;
  float *local_468;
  uint8_t local_460;
  uint8_t uStack_45f;
  undefined6 uStack_45e;
  float *local_458;
  undefined8 local_450;
  float *local_448;
  uint8_t local_440;
  uint8_t uStack_43f;
  undefined6 uStack_43e;
  float *local_438;
  uint8_t local_430;
  uint8_t uStack_42f;
  undefined6 uStack_42e;
  float *local_428;
  uint8_t local_420;
  uint8_t uStack_41f;
  undefined6 uStack_41e;
  float *local_418;
  uint8_t local_410;
  uint8_t uStack_40f;
  undefined6 uStack_40e;
  float *local_408;
  undefined8 local_400;
  float *local_3f8;
  undefined8 local_3f0;
  float *local_3e8;
  uint8_t local_3e0;
  uint8_t uStack_3df;
  undefined6 uStack_3de;
  float *local_3d8;
  undefined8 local_3d0;
  float *local_3c8;
  uint8_t local_3c0;
  uint8_t uStack_3bf;
  undefined6 uStack_3be;
  float *local_3b8;
  uint8_t local_3b0;
  uint8_t uStack_3af;
  undefined6 uStack_3ae;
  float *local_3a8;
  uint8_t local_3a0;
  uint8_t uStack_39f;
  undefined6 uStack_39e;
  float *local_398;
  uint8_t local_390;
  uint8_t uStack_38f;
  undefined6 uStack_38e;
  float *local_388;
  undefined8 local_380;
  float *local_378;
  undefined8 local_370;
  float *local_368;
  uint8_t local_360;
  uint8_t uStack_35f;
  undefined6 uStack_35e;
  float *local_358;
  undefined8 local_350;
  float *local_348;
  uint8_t local_340;
  uint8_t uStack_33f;
  undefined6 uStack_33e;
  float *local_338;
  uint8_t local_330;
  uint8_t uStack_32f;
  undefined6 uStack_32e;
  float *local_328;
  uint8_t local_320;
  uint8_t uStack_31f;
  undefined6 uStack_31e;
  float *local_318;
  uint8_t local_310;
  uint8_t uStack_30f;
  undefined6 uStack_30e;
  float *local_308;
  undefined8 local_300;
  float *local_2f8;
  undefined8 local_2f0;
  float *local_2e8;
  uint8_t local_2e0;
  uint8_t uStack_2df;
  undefined6 uStack_2de;
  float *local_2d8;
  undefined8 local_2d0;
  float *local_2c8;
  uint8_t local_2c0;
  uint8_t uStack_2bf;
  undefined6 uStack_2be;
  float *local_2b8;
  uint8_t local_2b0;
  uint8_t uStack_2af;
  undefined6 uStack_2ae;
  float *local_2a8;
  uint8_t local_2a0;
  uint8_t uStack_29f;
  undefined6 uStack_29e;
  float *local_298;
  uint8_t local_290;
  uint8_t uStack_28f;
  undefined6 uStack_28e;
  float *local_288;
  undefined8 local_280;
  float *local_278;
  undefined8 local_270;
  float *local_268;
  uint8_t local_260;
  uint8_t uStack_25f;
  undefined6 uStack_25e;
  float *local_258;
  undefined8 local_250;
  float *local_248;
  uint8_t local_240;
  uint8_t uStack_23f;
  undefined6 uStack_23e;
  float *local_238;
  uint8_t local_230;
  uint8_t uStack_22f;
  undefined6 uStack_22e;
  float *local_228;
  uint8_t local_220;
  uint8_t uStack_21f;
  undefined6 uStack_21e;
  float *local_218;
  uint8_t local_210;
  uint8_t uStack_20f;
  undefined6 uStack_20e;
  float *local_208;
  undefined8 local_200;
  float *local_1f8;
  undefined8 local_1f0;
  float *local_1e8;
  uint8_t local_1e0;
  uint8_t uStack_1df;
  undefined6 uStack_1de;
  float *local_1d8;
  undefined8 local_1d0;
  float *local_1c8;
  uint8_t local_1c0;
  uint8_t uStack_1bf;
  undefined6 uStack_1be;
  float *local_1b8;
  uint8_t local_1b0;
  uint8_t uStack_1af;
  undefined6 uStack_1ae;
  float *local_1a8;
  uint8_t local_1a0;
  uint8_t uStack_19f;
  undefined6 uStack_19e;
  float *local_198;
  uint8_t local_190;
  uint8_t uStack_18f;
  undefined6 uStack_18e;
  float *local_188;
  undefined8 local_180;
  float *local_178;
  undefined8 local_170;
  float *local_168;
  uint8_t local_160;
  uint8_t uStack_15f;
  undefined6 uStack_15e;
  float *local_158;
  undefined8 local_150;
  float *local_148;
  uint8_t local_140;
  uint8_t uStack_13f;
  undefined6 uStack_13e;
  float *local_138;
  uint8_t local_130;
  uint8_t uStack_12f;
  undefined6 uStack_12e;
  float *local_128;
  uint8_t local_120;
  uint8_t uStack_11f;
  undefined6 uStack_11e;
  float *local_118;
  uint8_t local_110;
  uint8_t uStack_10f;
  undefined6 uStack_10e;
  float *local_108;
  undefined8 local_100;
  float *local_f8;
  undefined8 local_f0;
  float *local_e8;
  uint8_t local_e0;
  uint8_t uStack_df;
  undefined6 uStack_de;
  float *local_d8;
  undefined8 local_d0;
  float *local_c8;
  uint8_t local_c0;
  uint8_t uStack_bf;
  undefined6 uStack_be;
  float *local_b8;
  uint8_t local_b0;
  uint8_t uStack_af;
  undefined6 uStack_ae;
  float *local_a8;
  uint8_t local_a0;
  uint8_t uStack_9f;
  undefined6 uStack_9e;
  float *local_98;
  uint8_t local_90;
  uint8_t uStack_8f;
  undefined6 uStack_8e;
  float *local_88;
  undefined8 local_80;
  float *local_78;
  undefined8 local_70;
  Matrix_t InverseMatrix;
  Matrix_t MatrixRotation_Z;
  float Theta_Swing;
  float Theta_Supporting;
  float Zero2Swing_Ending_PosY;
  float Zero2Swing_Ending_PosZ;
  float Zero2Swing_Ending_PosX;
  float Zero2Supporting_Ending_PosY;
  float Zero2Supporting_Ending_PosZ;
  float Zero2Supporting_Ending_PosX;
  float *ResultArray;
  float t;
  
  pMatrix = (float *)malloc(0x30);
  fVar3 = (sRobot_MotionPara.Phase_LF / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_LF) {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar8 = polyval(Coeff_X.pMatrix,4,fVar3 - SupportingTime_Walk);
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar4 = polyval(Coeff_Y.pMatrix,4,fVar3 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar6 = cos((double)(((fVar3 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar7 = sRobot_MotionPara.Span_W;
    fVar3 = polyval(Coeff_W.pMatrix,4,fVar3 - SupportingTime_Walk);
    MVar9 = SE3_Rz(((fVar7 * fVar3) / 3.1415927) * 180.0);
    local_f8 = MVar9.pMatrix;
    local_f0 = MVar9._8_8_;
    MVar9.row = Plane2Body.row;
    MVar9.column = Plane2Body.column;
    MVar9._10_6_ = Plane2Body._10_6_;
    MVar9.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(MVar9);
    local_108 = MVar9.pMatrix;
    local_100 = MVar9._8_8_;
    MVar9 = SE3_T((float)iVar2 * fVar4,(float)((dVar5 * (1.0 - dVar6)) / 2.0),(float)iVar1 * fVar8);
    local_118 = MVar9.pMatrix;
    Zero2Swing_Ending.pMatrix = local_118;
    _local_110 = MVar9._8_8_;
    Zero2Swing_Ending.row = local_110;
    Zero2Swing_Ending.column = uStack_10f;
    Zero2Swing_Ending._10_6_ = uStack_10e;
    MVar9 = MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,local_118,_local_110);
    local_128 = MVar9.pMatrix;
    Position2Swing_Ending.LF.pMatrix = local_128;
    _local_120 = MVar9._8_8_;
    Position2Swing_Ending.LF.row = local_120;
    Position2Swing_Ending.LF.column = uStack_11f;
    Position2Swing_Ending.LF._10_6_ = uStack_11e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_128,_local_120);
    local_138 = MVar9.pMatrix;
    Plane2Swing_Ending.LF.pMatrix = local_138;
    _local_130 = MVar9._8_8_;
    Plane2Swing_Ending.LF.row = local_130;
    Plane2Swing_Ending.LF.column = uStack_12f;
    Plane2Swing_Ending.LF._10_6_ = uStack_12e;
    MVar9 = MatrixMultiply(3,local_f8,local_f0,local_108,local_100,local_138,local_138,_local_130);
    local_148 = MVar9.pMatrix;
    Body2Swing_Ending.LF.pMatrix = local_148;
    _local_140 = MVar9._8_8_;
    Body2Swing_Ending.LF.row = local_140;
    Body2Swing_Ending.LF.column = uStack_13f;
    Body2Swing_Ending.LF._10_6_ = uStack_13e;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.LF.pMatrix);
    free(Plane2Swing_Ending.LF.pMatrix);
    free(local_f8);
    free(local_108);
    sMatrix_01.row = Body2Leg.LF.row;
    sMatrix_01.column = Body2Leg.LF.column;
    sMatrix_01._10_6_ = Body2Leg.LF._10_6_;
    sMatrix_01.pMatrix = Body2Leg.LF.pMatrix;
    MVar9 = Inv4(sMatrix_01);
    local_158 = MVar9.pMatrix;
    local_150 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_158,local_150,Body2Swing_Ending.LF.pMatrix,
                           Body2Swing_Ending.LF._8_8_);
    local_168 = MVar9.pMatrix;
    Leg2Swing_Ending.LF.pMatrix = local_168;
    _local_160 = MVar9._8_8_;
    Leg2Swing_Ending.LF.row = local_160;
    Leg2Swing_Ending.LF.column = uStack_15f;
    Leg2Swing_Ending.LF._10_6_ = uStack_15e;
    free(local_158);
    free(Body2Swing_Ending.LF.pMatrix);
    *pMatrix = Leg2Swing_Ending.LF.pMatrix[3];
    pMatrix[1] = Leg2Swing_Ending.LF.pMatrix[7];
    pMatrix[2] = Leg2Swing_Ending.LF.pMatrix[0xb];
    free(Leg2Swing_Ending.LF.pMatrix);
  }
  else {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar7 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar8 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    MVar9 = SE3_Rz(((sRobot_MotionPara.Span_W * (1.0 - (fVar3 * 4.0) / sRobot_MotionPara.Cycle)) /
                   3.1415927) * 180.0);
    local_78 = MVar9.pMatrix;
    local_70 = MVar9._8_8_;
    sMatrix.row = Plane2Body.row;
    sMatrix.column = Plane2Body.column;
    sMatrix._10_6_ = Plane2Body._10_6_;
    sMatrix.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix);
    local_88 = MVar9.pMatrix;
    local_80 = MVar9._8_8_;
    MVar9 = SE3_T((float)iVar2 * (1.0 - fVar8),fVar3 * 0.0,(float)iVar1 * (1.0 - fVar7));
    local_98 = MVar9.pMatrix;
    Zero2Supporting_Ending.pMatrix = local_98;
    _local_90 = MVar9._8_8_;
    Zero2Supporting_Ending.row = local_90;
    Zero2Supporting_Ending.column = uStack_8f;
    Zero2Supporting_Ending._10_6_ = uStack_8e;
    MVar9 = MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,local_98,_local_90);
    local_a8 = MVar9.pMatrix;
    Position2Supporting_Ending.LF.pMatrix = local_a8;
    _local_a0 = MVar9._8_8_;
    Position2Supporting_Ending.LF.row = local_a0;
    Position2Supporting_Ending.LF.column = uStack_9f;
    Position2Supporting_Ending.LF._10_6_ = uStack_9e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_a8,_local_a0);
    local_b8 = MVar9.pMatrix;
    Plane2Supporting_Ending.LF.pMatrix = local_b8;
    _local_b0 = MVar9._8_8_;
    Plane2Supporting_Ending.LF.row = local_b0;
    Plane2Supporting_Ending.LF.column = uStack_af;
    Plane2Supporting_Ending.LF._10_6_ = uStack_ae;
    MVar9 = MatrixMultiply(3,local_78,local_70,local_88,local_80,local_b8,local_b8,_local_b0);
    local_c8 = MVar9.pMatrix;
    Body2Supporting_Ending.LF.pMatrix = local_c8;
    _local_c0 = MVar9._8_8_;
    Body2Supporting_Ending.LF.row = local_c0;
    Body2Supporting_Ending.LF.column = uStack_bf;
    Body2Supporting_Ending.LF._10_6_ = uStack_be;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.LF.pMatrix);
    free(Plane2Supporting_Ending.LF.pMatrix);
    free(local_78);
    free(local_88);
    sMatrix_00.row = Body2Leg.LF.row;
    sMatrix_00.column = Body2Leg.LF.column;
    sMatrix_00._10_6_ = Body2Leg.LF._10_6_;
    sMatrix_00.pMatrix = Body2Leg.LF.pMatrix;
    MVar9 = Inv4(sMatrix_00);
    local_d8 = MVar9.pMatrix;
    local_d0 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_d8,local_d0,Body2Supporting_Ending.LF.pMatrix,
                           Body2Supporting_Ending.LF._8_8_);
    local_e8 = MVar9.pMatrix;
    Leg2Supporting_Ending.LF.pMatrix = local_e8;
    _local_e0 = MVar9._8_8_;
    Leg2Supporting_Ending.LF.row = local_e0;
    Leg2Supporting_Ending.LF.column = uStack_df;
    Leg2Supporting_Ending.LF._10_6_ = uStack_de;
    free(local_d8);
    free(Body2Supporting_Ending.LF.pMatrix);
    *pMatrix = Leg2Supporting_Ending.LF.pMatrix[3];
    pMatrix[1] = Leg2Supporting_Ending.LF.pMatrix[7];
    pMatrix[2] = Leg2Supporting_Ending.LF.pMatrix[0xb];
    free(Leg2Supporting_Ending.LF.pMatrix);
  }
  fVar3 = (sRobot_MotionPara.Phase_LH / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_LH) {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar8 = polyval(Coeff_X.pMatrix,4,fVar3 - SupportingTime_Walk);
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar4 = polyval(Coeff_Y.pMatrix,4,fVar3 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar6 = cos((double)(((fVar3 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar7 = sRobot_MotionPara.Span_W;
    fVar3 = polyval(Coeff_W.pMatrix,4,fVar3 - SupportingTime_Walk);
    MVar9 = SE3_Rz(((fVar7 * fVar3) / 3.1415927) * 180.0);
    local_1f8 = MVar9.pMatrix;
    local_1f0 = MVar9._8_8_;
    sMatrix_04.row = Plane2Body.row;
    sMatrix_04.column = Plane2Body.column;
    sMatrix_04._10_6_ = Plane2Body._10_6_;
    sMatrix_04.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_04);
    local_208 = MVar9.pMatrix;
    local_200 = MVar9._8_8_;
    MVar9 = SE3_T((float)iVar2 * fVar4,-(float)((dVar5 * (1.0 - dVar6)) / 2.0),
                  -((float)iVar1 * fVar8));
    local_218 = MVar9.pMatrix;
    Zero2Swing_Ending.pMatrix = local_218;
    _local_210 = MVar9._8_8_;
    Zero2Swing_Ending.row = local_210;
    Zero2Swing_Ending.column = uStack_20f;
    Zero2Swing_Ending._10_6_ = uStack_20e;
    MVar9 = MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,local_218,_local_210);
    local_228 = MVar9.pMatrix;
    Position2Swing_Ending.LH.pMatrix = local_228;
    _local_220 = MVar9._8_8_;
    Position2Swing_Ending.LH.row = local_220;
    Position2Swing_Ending.LH.column = uStack_21f;
    Position2Swing_Ending.LH._10_6_ = uStack_21e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_228,_local_220);
    local_238 = MVar9.pMatrix;
    Plane2Swing_Ending.LH.pMatrix = local_238;
    _local_230 = MVar9._8_8_;
    Plane2Swing_Ending.LH.row = local_230;
    Plane2Swing_Ending.LH.column = uStack_22f;
    Plane2Swing_Ending.LH._10_6_ = uStack_22e;
    MVar9 = MatrixMultiply(3,local_1f8,local_1f0,local_208,local_200,local_238,local_238,_local_230)
    ;
    local_248 = MVar9.pMatrix;
    Body2Swing_Ending.LH.pMatrix = local_248;
    _local_240 = MVar9._8_8_;
    Body2Swing_Ending.LH.row = local_240;
    Body2Swing_Ending.LH.column = uStack_23f;
    Body2Swing_Ending.LH._10_6_ = uStack_23e;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.LH.pMatrix);
    free(Plane2Swing_Ending.LH.pMatrix);
    free(local_1f8);
    free(local_208);
    sMatrix_05.row = Body2Leg.LH.row;
    sMatrix_05.column = Body2Leg.LH.column;
    sMatrix_05._10_6_ = Body2Leg.LH._10_6_;
    sMatrix_05.pMatrix = Body2Leg.LH.pMatrix;
    MVar9 = Inv4(sMatrix_05);
    local_258 = MVar9.pMatrix;
    local_250 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_258,local_250,Body2Swing_Ending.LH.pMatrix,
                           Body2Swing_Ending.LH._8_8_);
    local_268 = MVar9.pMatrix;
    Leg2Swing_Ending.LH.pMatrix = local_268;
    _local_260 = MVar9._8_8_;
    Leg2Swing_Ending.LH.row = local_260;
    Leg2Swing_Ending.LH.column = uStack_25f;
    Leg2Swing_Ending.LH._10_6_ = uStack_25e;
    free(local_258);
    free(Body2Swing_Ending.LH.pMatrix);
    pMatrix[9] = Leg2Swing_Ending.LH.pMatrix[3];
    pMatrix[10] = Leg2Swing_Ending.LH.pMatrix[7];
    pMatrix[0xb] = Leg2Swing_Ending.LH.pMatrix[0xb];
    free(Leg2Swing_Ending.LH.pMatrix);
  }
  else {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar7 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar8 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    MVar9 = SE3_Rz(((sRobot_MotionPara.Span_W * (1.0 - (fVar3 * 4.0) / sRobot_MotionPara.Cycle)) /
                   3.1415927) * 180.0);
    local_178 = MVar9.pMatrix;
    local_170 = MVar9._8_8_;
    sMatrix_02.row = Plane2Body.row;
    sMatrix_02.column = Plane2Body.column;
    sMatrix_02._10_6_ = Plane2Body._10_6_;
    sMatrix_02.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_02);
    local_188 = MVar9.pMatrix;
    local_180 = MVar9._8_8_;
    MVar9 = SE3_T((float)iVar2 * (1.0 - fVar8),-(fVar3 * 0.0),-((float)iVar1 * (1.0 - fVar7)));
    local_198 = MVar9.pMatrix;
    Zero2Supporting_Ending.pMatrix = local_198;
    _local_190 = MVar9._8_8_;
    Zero2Supporting_Ending.row = local_190;
    Zero2Supporting_Ending.column = uStack_18f;
    Zero2Supporting_Ending._10_6_ = uStack_18e;
    MVar9 = MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,local_198,_local_190);
    local_1a8 = MVar9.pMatrix;
    Position2Supporting_Ending.LH.pMatrix = local_1a8;
    _local_1a0 = MVar9._8_8_;
    Position2Supporting_Ending.LH.row = local_1a0;
    Position2Supporting_Ending.LH.column = uStack_19f;
    Position2Supporting_Ending.LH._10_6_ = uStack_19e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_1a8,_local_1a0);
    local_1b8 = MVar9.pMatrix;
    Plane2Supporting_Ending.LH.pMatrix = local_1b8;
    _local_1b0 = MVar9._8_8_;
    Plane2Supporting_Ending.LH.row = local_1b0;
    Plane2Supporting_Ending.LH.column = uStack_1af;
    Plane2Supporting_Ending.LH._10_6_ = uStack_1ae;
    MVar9 = MatrixMultiply(3,local_178,local_170,local_188,local_180,local_1b8,local_1b8,_local_1b0)
    ;
    local_1c8 = MVar9.pMatrix;
    Body2Supporting_Ending.LH.pMatrix = local_1c8;
    _local_1c0 = MVar9._8_8_;
    Body2Supporting_Ending.LH.row = local_1c0;
    Body2Supporting_Ending.LH.column = uStack_1bf;
    Body2Supporting_Ending.LH._10_6_ = uStack_1be;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.LH.pMatrix);
    free(Plane2Supporting_Ending.LH.pMatrix);
    free(local_178);
    free(local_188);
    sMatrix_03.row = Body2Leg.LH.row;
    sMatrix_03.column = Body2Leg.LH.column;
    sMatrix_03._10_6_ = Body2Leg.LH._10_6_;
    sMatrix_03.pMatrix = Body2Leg.LH.pMatrix;
    MVar9 = Inv4(sMatrix_03);
    local_1d8 = MVar9.pMatrix;
    local_1d0 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_1d8,local_1d0,Body2Supporting_Ending.LH.pMatrix,
                           Body2Supporting_Ending.LH._8_8_);
    local_1e8 = MVar9.pMatrix;
    Leg2Supporting_Ending.LH.pMatrix = local_1e8;
    _local_1e0 = MVar9._8_8_;
    Leg2Supporting_Ending.LH.row = local_1e0;
    Leg2Supporting_Ending.LH.column = uStack_1df;
    Leg2Supporting_Ending.LH._10_6_ = uStack_1de;
    free(local_1d8);
    free(Body2Supporting_Ending.LH.pMatrix);
    pMatrix[9] = Leg2Supporting_Ending.LH.pMatrix[3];
    pMatrix[10] = Leg2Supporting_Ending.LH.pMatrix[7];
    pMatrix[0xb] = Leg2Supporting_Ending.LH.pMatrix[0xb];
    free(Leg2Supporting_Ending.LH.pMatrix);
  }
  fVar3 = (sRobot_MotionPara.Phase_RH / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_RH) {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar8 = polyval(Coeff_X.pMatrix,4,fVar3 - SupportingTime_Walk);
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar4 = polyval(Coeff_Y.pMatrix,4,fVar3 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar6 = cos((double)(((fVar3 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar7 = sRobot_MotionPara.Span_W;
    fVar3 = polyval(Coeff_W.pMatrix,4,fVar3 - SupportingTime_Walk);
    MVar9 = SE3_Rz(((fVar7 * fVar3) / 3.1415927) * 180.0);
    local_2f8 = MVar9.pMatrix;
    local_2f0 = MVar9._8_8_;
    sMatrix_08.row = Plane2Body.row;
    sMatrix_08.column = Plane2Body.column;
    sMatrix_08._10_6_ = Plane2Body._10_6_;
    sMatrix_08.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_08);
    local_308 = MVar9.pMatrix;
    local_300 = MVar9._8_8_;
    MVar9 = SE3_T(-((float)iVar2 * fVar4),(float)((dVar5 * (1.0 - dVar6)) / 2.0),
                  -((float)iVar1 * fVar8));
    local_318 = MVar9.pMatrix;
    Zero2Swing_Ending.pMatrix = local_318;
    _local_310 = MVar9._8_8_;
    Zero2Swing_Ending.row = local_310;
    Zero2Swing_Ending.column = uStack_30f;
    Zero2Swing_Ending._10_6_ = uStack_30e;
    MVar9 = MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,local_318,_local_310);
    local_328 = MVar9.pMatrix;
    Position2Swing_Ending.RH.pMatrix = local_328;
    _local_320 = MVar9._8_8_;
    Position2Swing_Ending.RH.row = local_320;
    Position2Swing_Ending.RH.column = uStack_31f;
    Position2Swing_Ending.RH._10_6_ = uStack_31e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_328,_local_320);
    local_338 = MVar9.pMatrix;
    Plane2Swing_Ending.RH.pMatrix = local_338;
    _local_330 = MVar9._8_8_;
    Plane2Swing_Ending.RH.row = local_330;
    Plane2Swing_Ending.RH.column = uStack_32f;
    Plane2Swing_Ending.RH._10_6_ = uStack_32e;
    MVar9 = MatrixMultiply(3,local_2f8,local_2f0,local_308,local_300,local_338,local_338,_local_330)
    ;
    local_348 = MVar9.pMatrix;
    Body2Swing_Ending.RH.pMatrix = local_348;
    _local_340 = MVar9._8_8_;
    Body2Swing_Ending.RH.row = local_340;
    Body2Swing_Ending.RH.column = uStack_33f;
    Body2Swing_Ending.RH._10_6_ = uStack_33e;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.RH.pMatrix);
    free(Plane2Swing_Ending.RH.pMatrix);
    free(local_2f8);
    free(local_308);
    sMatrix_09.row = Body2Leg.RH.row;
    sMatrix_09.column = Body2Leg.RH.column;
    sMatrix_09._10_6_ = Body2Leg.RH._10_6_;
    sMatrix_09.pMatrix = Body2Leg.RH.pMatrix;
    MVar9 = Inv4(sMatrix_09);
    local_358 = MVar9.pMatrix;
    local_350 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_358,local_350,Body2Swing_Ending.RH.pMatrix,
                           Body2Swing_Ending.RH._8_8_);
    local_368 = MVar9.pMatrix;
    Leg2Swing_Ending.RH.pMatrix = local_368;
    _local_360 = MVar9._8_8_;
    Leg2Swing_Ending.RH.row = local_360;
    Leg2Swing_Ending.RH.column = uStack_35f;
    Leg2Swing_Ending.RH._10_6_ = uStack_35e;
    free(local_358);
    free(Body2Swing_Ending.RH.pMatrix);
    pMatrix[3] = Leg2Swing_Ending.RH.pMatrix[3];
    pMatrix[4] = Leg2Swing_Ending.RH.pMatrix[7];
    pMatrix[5] = Leg2Swing_Ending.RH.pMatrix[0xb];
    free(Leg2Swing_Ending.RH.pMatrix);
  }
  else {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar7 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar8 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    MVar9 = SE3_Rz(((sRobot_MotionPara.Span_W * (1.0 - (fVar3 * 4.0) / sRobot_MotionPara.Cycle)) /
                   3.1415927) * 180.0);
    local_278 = MVar9.pMatrix;
    local_270 = MVar9._8_8_;
    sMatrix_06.row = Plane2Body.row;
    sMatrix_06.column = Plane2Body.column;
    sMatrix_06._10_6_ = Plane2Body._10_6_;
    sMatrix_06.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_06);
    local_288 = MVar9.pMatrix;
    local_280 = MVar9._8_8_;
    MVar9 = SE3_T(-((float)iVar2 * (1.0 - fVar8)),fVar3 * 0.0,-((float)iVar1 * (1.0 - fVar7)));
    local_298 = MVar9.pMatrix;
    Zero2Supporting_Ending.pMatrix = local_298;
    _local_290 = MVar9._8_8_;
    Zero2Supporting_Ending.row = local_290;
    Zero2Supporting_Ending.column = uStack_28f;
    Zero2Supporting_Ending._10_6_ = uStack_28e;
    MVar9 = MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,local_298,_local_290);
    local_2a8 = MVar9.pMatrix;
    Position2Supporting_Ending.RH.pMatrix = local_2a8;
    _local_2a0 = MVar9._8_8_;
    Position2Supporting_Ending.RH.row = local_2a0;
    Position2Supporting_Ending.RH.column = uStack_29f;
    Position2Supporting_Ending.RH._10_6_ = uStack_29e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_2a8,_local_2a0);
    local_2b8 = MVar9.pMatrix;
    Plane2Supporting_Ending.RH.pMatrix = local_2b8;
    _local_2b0 = MVar9._8_8_;
    Plane2Supporting_Ending.RH.row = local_2b0;
    Plane2Supporting_Ending.RH.column = uStack_2af;
    Plane2Supporting_Ending.RH._10_6_ = uStack_2ae;
    MVar9 = MatrixMultiply(3,local_278,local_270,local_288,local_280,local_2b8,local_2b8,_local_2b0)
    ;
    local_2c8 = MVar9.pMatrix;
    Body2Supporting_Ending.RH.pMatrix = local_2c8;
    _local_2c0 = MVar9._8_8_;
    Body2Supporting_Ending.RH.row = local_2c0;
    Body2Supporting_Ending.RH.column = uStack_2bf;
    Body2Supporting_Ending.RH._10_6_ = uStack_2be;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.RH.pMatrix);
    free(Plane2Supporting_Ending.RH.pMatrix);
    free(local_278);
    free(local_288);
    sMatrix_07.row = Body2Leg.RH.row;
    sMatrix_07.column = Body2Leg.RH.column;
    sMatrix_07._10_6_ = Body2Leg.RH._10_6_;
    sMatrix_07.pMatrix = Body2Leg.RH.pMatrix;
    MVar9 = Inv4(sMatrix_07);
    local_2d8 = MVar9.pMatrix;
    local_2d0 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_2d8,local_2d0,Body2Supporting_Ending.RH.pMatrix,
                           Body2Supporting_Ending.RH._8_8_);
    local_2e8 = MVar9.pMatrix;
    Leg2Supporting_Ending.RH.pMatrix = local_2e8;
    _local_2e0 = MVar9._8_8_;
    Leg2Supporting_Ending.RH.row = local_2e0;
    Leg2Supporting_Ending.RH.column = uStack_2df;
    Leg2Supporting_Ending.RH._10_6_ = uStack_2de;
    free(local_2d8);
    free(Body2Supporting_Ending.RH.pMatrix);
    pMatrix[3] = Leg2Supporting_Ending.RH.pMatrix[3];
    pMatrix[4] = Leg2Supporting_Ending.RH.pMatrix[7];
    pMatrix[5] = Leg2Supporting_Ending.RH.pMatrix[0xb];
    free(Leg2Supporting_Ending.RH.pMatrix);
  }
  fVar3 = (sRobot_MotionPara.Phase_RF / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_RF) {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar8 = polyval(Coeff_X.pMatrix,4,fVar3 - SupportingTime_Walk);
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar4 = polyval(Coeff_Y.pMatrix,4,fVar3 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar6 = cos((double)(((fVar3 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar7 = sRobot_MotionPara.Span_W;
    fVar3 = polyval(Coeff_W.pMatrix,4,fVar3 - SupportingTime_Walk);
    MVar9 = SE3_Rz(((fVar7 * fVar3) / 3.1415927) * 180.0);
    local_3f8 = MVar9.pMatrix;
    local_3f0 = MVar9._8_8_;
    sMatrix_12.row = Plane2Body.row;
    sMatrix_12.column = Plane2Body.column;
    sMatrix_12._10_6_ = Plane2Body._10_6_;
    sMatrix_12.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_12);
    local_408 = MVar9.pMatrix;
    local_400 = MVar9._8_8_;
    MVar9 = SE3_T(-((float)iVar2 * fVar4),-(float)((dVar5 * (1.0 - dVar6)) / 2.0),
                  (float)iVar1 * fVar8);
    local_418 = MVar9.pMatrix;
    Zero2Swing_Ending.pMatrix = local_418;
    _local_410 = MVar9._8_8_;
    Zero2Swing_Ending.row = local_410;
    Zero2Swing_Ending.column = uStack_40f;
    Zero2Swing_Ending._10_6_ = uStack_40e;
    MVar9 = MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,local_418,_local_410);
    local_428 = MVar9.pMatrix;
    Position2Swing_Ending.RF.pMatrix = local_428;
    _local_420 = MVar9._8_8_;
    Position2Swing_Ending.RF.row = local_420;
    Position2Swing_Ending.RF.column = uStack_41f;
    Position2Swing_Ending.RF._10_6_ = uStack_41e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_428,_local_420);
    local_438 = MVar9.pMatrix;
    Plane2Swing_Ending.RF.pMatrix = local_438;
    _local_430 = MVar9._8_8_;
    Plane2Swing_Ending.RF.row = local_430;
    Plane2Swing_Ending.RF.column = uStack_42f;
    Plane2Swing_Ending.RF._10_6_ = uStack_42e;
    MVar9 = MatrixMultiply(3,local_3f8,local_3f0,local_408,local_400,local_438,local_438,_local_430)
    ;
    local_448 = MVar9.pMatrix;
    Body2Swing_Ending.RF.pMatrix = local_448;
    _local_440 = MVar9._8_8_;
    Body2Swing_Ending.RF.row = local_440;
    Body2Swing_Ending.RF.column = uStack_43f;
    Body2Swing_Ending.RF._10_6_ = uStack_43e;
    free(Zero2Swing_Ending.pMatrix);
    free(Position2Swing_Ending.RF.pMatrix);
    free(Plane2Swing_Ending.RF.pMatrix);
    free(local_3f8);
    free(local_408);
    sMatrix_13.row = Body2Leg.RF.row;
    sMatrix_13.column = Body2Leg.RF.column;
    sMatrix_13._10_6_ = Body2Leg.RF._10_6_;
    sMatrix_13.pMatrix = Body2Leg.RF.pMatrix;
    MVar9 = Inv4(sMatrix_13);
    local_458 = MVar9.pMatrix;
    local_450 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_458,local_450,Body2Swing_Ending.RF.pMatrix,
                           Body2Swing_Ending.RF._8_8_);
    local_468 = MVar9.pMatrix;
    Leg2Swing_Ending.RF.pMatrix = local_468;
    _local_460 = MVar9._8_8_;
    Leg2Swing_Ending.RF.row = local_460;
    Leg2Swing_Ending.RF.column = uStack_45f;
    Leg2Swing_Ending.RF._10_6_ = uStack_45e;
    free(local_458);
    free(Body2Swing_Ending.RF.pMatrix);
    pMatrix[6] = Leg2Swing_Ending.RF.pMatrix[3];
    pMatrix[7] = Leg2Swing_Ending.RF.pMatrix[7];
    pMatrix[8] = Leg2Swing_Ending.RF.pMatrix[0xb];
    free(Leg2Swing_Ending.RF.pMatrix);
  }
  else {
    iVar1 = sRobot_MotionPara.Span_Z / 2;
    fVar7 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    iVar2 = sRobot_MotionPara.Span_X / 2;
    fVar8 = (fVar3 * 4.0) / sRobot_MotionPara.Cycle;
    MVar9 = SE3_Rz(((sRobot_MotionPara.Span_W * (1.0 - (fVar3 * 4.0) / sRobot_MotionPara.Cycle)) /
                   3.1415927) * 180.0);
    local_378 = MVar9.pMatrix;
    local_370 = MVar9._8_8_;
    sMatrix_10.row = Plane2Body.row;
    sMatrix_10.column = Plane2Body.column;
    sMatrix_10._10_6_ = Plane2Body._10_6_;
    sMatrix_10.pMatrix = Plane2Body.pMatrix;
    MVar9 = Inv4(sMatrix_10);
    local_388 = MVar9.pMatrix;
    local_380 = MVar9._8_8_;
    MVar9 = SE3_T(-((float)iVar2 * (1.0 - fVar8)),-(fVar3 * 0.0),(float)iVar1 * (1.0 - fVar7));
    local_398 = MVar9.pMatrix;
    Zero2Supporting_Ending.pMatrix = local_398;
    _local_390 = MVar9._8_8_;
    Zero2Supporting_Ending.row = local_390;
    Zero2Supporting_Ending.column = uStack_38f;
    Zero2Supporting_Ending._10_6_ = uStack_38e;
    MVar9 = MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,local_398,_local_390);
    local_3a8 = MVar9.pMatrix;
    Position2Supporting_Ending.RF.pMatrix = local_3a8;
    _local_3a0 = MVar9._8_8_;
    Position2Supporting_Ending.RF.row = local_3a0;
    Position2Supporting_Ending.RF.column = uStack_39f;
    Position2Supporting_Ending.RF._10_6_ = uStack_39e;
    MVar9 = MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,local_3a8,_local_3a0);
    local_3b8 = MVar9.pMatrix;
    Plane2Supporting_Ending.RF.pMatrix = local_3b8;
    _local_3b0 = MVar9._8_8_;
    Plane2Supporting_Ending.RF.row = local_3b0;
    Plane2Supporting_Ending.RF.column = uStack_3af;
    Plane2Supporting_Ending.RF._10_6_ = uStack_3ae;
    MVar9 = MatrixMultiply(3,local_378,local_370,local_388,local_380,local_3b8,local_3b8,_local_3b0)
    ;
    local_3c8 = MVar9.pMatrix;
    Body2Supporting_Ending.RF.pMatrix = local_3c8;
    _local_3c0 = MVar9._8_8_;
    Body2Supporting_Ending.RF.row = local_3c0;
    Body2Supporting_Ending.RF.column = uStack_3bf;
    Body2Supporting_Ending.RF._10_6_ = uStack_3be;
    free(Zero2Supporting_Ending.pMatrix);
    free(Position2Supporting_Ending.RF.pMatrix);
    free(Plane2Supporting_Ending.RF.pMatrix);
    free(local_378);
    free(local_388);
    sMatrix_11.row = Body2Leg.RF.row;
    sMatrix_11.column = Body2Leg.RF.column;
    sMatrix_11._10_6_ = Body2Leg.RF._10_6_;
    sMatrix_11.pMatrix = Body2Leg.RF.pMatrix;
    MVar9 = Inv4(sMatrix_11);
    local_3d8 = MVar9.pMatrix;
    local_3d0 = MVar9._8_8_;
    MVar9 = MatrixMultiply(2,local_3d8,local_3d0,Body2Supporting_Ending.RF.pMatrix,
                           Body2Supporting_Ending.RF._8_8_);
    local_3e8 = MVar9.pMatrix;
    Leg2Supporting_Ending.RF.pMatrix = local_3e8;
    _local_3e0 = MVar9._8_8_;
    Leg2Supporting_Ending.RF.row = local_3e0;
    Leg2Supporting_Ending.RF.column = uStack_3df;
    Leg2Supporting_Ending.RF._10_6_ = uStack_3de;
    free(local_3d8);
    free(Body2Supporting_Ending.RF.pMatrix);
    pMatrix[6] = Leg2Supporting_Ending.RF.pMatrix[3];
    pMatrix[7] = Leg2Supporting_Ending.RF.pMatrix[7];
    pMatrix[8] = Leg2Supporting_Ending.RF.pMatrix[0xb];
    free(Leg2Supporting_Ending.RF.pMatrix);
  }
  MVar9 = Arr2Mat(pMatrix,'\x04','\x03');
  return MVar9;
}

Assistant:

Matrix_t Calc_GaitTrajPoint_Walk(void)
{
	float t;
	float *ResultArray = (float *)malloc(sizeof(float) * 4 * 3);
	float Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosZ, Zero2Supporting_Ending_PosY;
	float Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosZ, Zero2Swing_Ending_PosY;
	float Theta_Supporting, Theta_Swing;
	Matrix_t MatrixRotation_Z, InverseMatrix;

	t = sRobot_MotionPara.Phase_LF / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_LF < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LF);
		Body2Supporting_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LF.pMatrix);
		free(Plane2Supporting_Ending.LF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Supporting_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LF.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Supporting_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Supporting_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Supporting_Ending.LF.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.LF.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Swing_Ending);
		Plane2Swing_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LF);
		Body2Swing_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LF.pMatrix);
		free(Plane2Swing_Ending.LF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Swing_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LF.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Swing_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Swing_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Swing_Ending.LF.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.LF.pMatrix);
	}

	t = sRobot_MotionPara.Phase_LH / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_LH < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LH);
		Body2Supporting_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LH.pMatrix);
		free(Plane2Supporting_Ending.LH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Supporting_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LH.pMatrix);

		*(ResultArray + 3 * 3 + 0) = *(Leg2Supporting_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Supporting_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Supporting_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.LH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Swing_Ending);
		Plane2Swing_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LH);
		Body2Swing_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LH.pMatrix);
		free(Plane2Swing_Ending.LH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Swing_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LH.pMatrix);

		*(ResultArray + 3 * 3 + 0) = *(Leg2Swing_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Swing_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Swing_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.LH.pMatrix);
	}

	t = sRobot_MotionPara.Phase_RH / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_RH < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RH);
		Body2Supporting_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RH.pMatrix);
		free(Plane2Supporting_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Supporting_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RH.pMatrix);

		*(ResultArray + 1 * 3 + 0) = *(Leg2Supporting_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Supporting_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Supporting_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.RH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Swing_Ending);
		Plane2Swing_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RH);
		Body2Swing_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RH.pMatrix);
		free(Plane2Swing_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Swing_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RH.pMatrix);

		*(ResultArray + 1 * 3 + 0) = *(Leg2Swing_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Swing_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Swing_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.RH.pMatrix);
	}

	t = sRobot_MotionPara.Phase_RF / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_RF < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RF);
		Body2Supporting_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RF.pMatrix);
		free(Plane2Supporting_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Supporting_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Supporting_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Supporting_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Supporting_Ending.RF.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.RF.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Swing_Ending);
		Plane2Swing_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RF);
		Body2Swing_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RF.pMatrix);
		free(Plane2Swing_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Swing_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Swing_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Swing_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Swing_Ending.RF.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.RF.pMatrix);
	}

	return Arr2Mat(ResultArray, 4, 3);
}